

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::ConfigureString
          (cmMakefile *this,string *input,string *output,bool atOnly,bool escapeQuotes)

{
  RegularExpression *this_00;
  RegularExpression *this_01;
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  string local_a0;
  string *local_80;
  cmMakefile *local_78;
  string line;
  
  local_80 = output;
  if (input->_M_string_length != 0) {
    pcVar4 = (input->_M_dataplus)._M_p;
    pcVar3 = pcVar4 + input->_M_string_length;
    this_00 = &this->cmDefineRegex;
    this_01 = &this->cmDefine01Regex;
    pcVar5 = pcVar4;
    local_78 = this;
LAB_00256344:
    do {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      pcVar6 = pcVar5;
      if (*pcVar5 != '\n') {
        pcVar5 = pcVar5 + 1;
        pcVar6 = pcVar3;
        if (pcVar5 != pcVar3) goto LAB_00256344;
      }
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&line,pcVar4,pcVar6);
      pcVar4 = (input->_M_dataplus)._M_p + input->_M_string_length;
      bVar2 = cmsys::RegularExpression::find(this_00,line._M_dataplus._M_p);
      pcVar1 = local_78;
      if (bVar2) {
        pcVar5 = (local_78->cmDefineRegex).startp[1];
        if (pcVar5 == (char *)0x0) {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          local_a0._M_string_length = 0;
          local_a0.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,pcVar5,(local_78->cmDefineRegex).endp[1]);
        }
        pcVar5 = GetDefinition(pcVar1,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,
                          CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                   local_a0.field_2._M_local_buf[0]) + 1);
        }
        bVar2 = cmSystemTools::IsOff(pcVar5);
        if (bVar2) {
          std::__cxx11::string::append((char *)local_80);
          pcVar5 = (local_78->cmDefineRegex).startp[1];
          if (pcVar5 == (char *)0x0) {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            local_a0._M_string_length = 0;
            local_a0.field_2._M_local_buf[0] = '\0';
          }
          else {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a0,pcVar5,(local_78->cmDefineRegex).endp[1]);
          }
          std::__cxx11::string::_M_append((char *)local_80,(ulong)local_a0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,
                            CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                     local_a0.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::string::append((char *)local_80);
        }
        else {
          cmsys::SystemTools::ReplaceString(&line,"#cmakedefine","#define");
          std::__cxx11::string::_M_append((char *)local_80,(ulong)line._M_dataplus._M_p);
        }
      }
      else {
        bVar2 = cmsys::RegularExpression::find(this_01,line._M_dataplus._M_p);
        pcVar1 = local_78;
        if (bVar2) {
          pcVar5 = (local_78->cmDefine01Regex).startp[1];
          if (pcVar5 == (char *)0x0) {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            local_a0._M_string_length = 0;
            local_a0.field_2._M_local_buf[0] = '\0';
          }
          else {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a0,pcVar5,(local_78->cmDefine01Regex).endp[1]);
          }
          pcVar5 = GetDefinition(pcVar1,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,
                            CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                     local_a0.field_2._M_local_buf[0]) + 1);
          }
          cmsys::SystemTools::ReplaceString(&line,"#cmakedefine01","#define");
          std::__cxx11::string::_M_append((char *)local_80,(ulong)line._M_dataplus._M_p);
          cmSystemTools::IsOff(pcVar5);
          std::__cxx11::string::append((char *)local_80);
        }
        else {
          std::__cxx11::string::_M_append((char *)local_80,(ulong)line._M_dataplus._M_p);
        }
      }
      if (pcVar6 != pcVar4) {
        std::__cxx11::string::append((char *)local_80);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != &line.field_2) {
        operator_delete(line._M_dataplus._M_p,line.field_2._M_allocated_capacity + 1);
      }
      pcVar4 = pcVar6 + (pcVar6 != pcVar4);
      pcVar3 = (input->_M_dataplus)._M_p + input->_M_string_length;
      this = local_78;
      pcVar5 = pcVar4;
    } while (pcVar4 != pcVar3);
  }
  ExpandVariablesInString(this,local_80,escapeQuotes,true,atOnly,(char *)0x0,-1,true,true);
  return;
}

Assistant:

void cmMakefile::ConfigureString(const std::string& input,
                                 std::string& output, bool atOnly,
                                 bool escapeQuotes) const
{
  // Split input to handle one line at a time.
  std::string::const_iterator lineStart = input.begin();
  while(lineStart != input.end())
    {
    // Find the end of this line.
    std::string::const_iterator lineEnd = lineStart;
    while(lineEnd != input.end() && *lineEnd != '\n')
      {
      ++lineEnd;
      }

    // Copy the line.
    std::string line(lineStart, lineEnd);

    // Skip the newline character.
    bool haveNewline = (lineEnd != input.end());
    if(haveNewline)
      {
      ++lineEnd;
      }

    // Replace #cmakedefine instances.
    if(this->cmDefineRegex.find(line))
      {
      const char* def =
        this->GetDefinition(this->cmDefineRegex.match(1));
      if(!cmSystemTools::IsOff(def))
        {
        cmSystemTools::ReplaceString(line, "#cmakedefine", "#define");
        output += line;
        }
      else
        {
        output += "/* #undef ";
        output += this->cmDefineRegex.match(1);
        output += " */";
        }
      }
    else if(this->cmDefine01Regex.find(line))
      {
      const char* def =
        this->GetDefinition(this->cmDefine01Regex.match(1));
      cmSystemTools::ReplaceString(line, "#cmakedefine01", "#define");
      output += line;
      if(!cmSystemTools::IsOff(def))
        {
        output += " 1";
        }
      else
        {
        output += " 0";
        }
      }
    else
      {
      output += line;
      }

    if(haveNewline)
      {
      output += "\n";
      }

    // Move to the next line.
    lineStart = lineEnd;
    }

  // Perform variable replacements.
  this->ExpandVariablesInString(output, escapeQuotes, true,
                                atOnly, 0, -1, true, true);
}